

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.cpp
# Opt level: O0

int __thiscall arangodb::velocypack::Builder::close(Builder *this,int __fd)

{
  iterator indexStart_00;
  bool bVar1;
  reference pvVar2;
  undefined8 uVar3;
  Slice obj;
  ValueLength VVar4;
  reference puVar5;
  Exception *this_00;
  ulong uVar6;
  uint i_3;
  ValueLength x_2;
  uint i_2;
  ValueLength x;
  ValueLength byteLength;
  size_t j;
  uint64_t x_1;
  size_t i_1;
  ValueLength tableBase;
  size_t i;
  ValueLength diff;
  ValueLength len;
  ValueLength targetPos;
  uint offsetSize;
  ValueLength n;
  iterator indexEnd;
  iterator indexStart;
  bool isArray;
  uint8_t head;
  ValueLength indexStartPos;
  ValueLength pos;
  undefined4 in_stack_fffffffffffffe98;
  ExceptionType in_stack_fffffffffffffe9c;
  Builder *in_stack_fffffffffffffea0;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffffea8;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffffeb0;
  Slice in_stack_fffffffffffffeb8;
  bool local_129;
  uint8_t *in_stack_fffffffffffffed8;
  iterator in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  uint in_stack_fffffffffffffef4;
  iterator in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  uint uVar7;
  ulong local_f8;
  ulong local_e8;
  ulong local_e0;
  ulong local_d8;
  ulong local_b8;
  uint local_94;
  Slice local_78;
  unsigned_long *local_70;
  unsigned_long *local_68;
  unsigned_long *local_60;
  unsigned_long *local_58;
  ulong local_50;
  unsigned_long *local_48;
  unsigned_long *local_40;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_38;
  undefined6 in_stack_ffffffffffffffd0;
  uint8_t uVar8;
  Builder *this_01;
  iterator indexEnd_00;
  iterator iVar9;
  int local_10;
  
  iVar9._M_current = (unsigned_long *)this;
  bVar1 = isClosed((Builder *)0x107941);
  if (bVar1) {
    uVar3 = __cxa_allocate_exception(0x18);
    Exception::Exception((Exception *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c);
    __cxa_throw(uVar3,&Exception::typeinfo,Exception::~Exception);
  }
  pvVar2 = std::
           vector<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
           ::back((vector<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
                   *)in_stack_fffffffffffffea0);
  indexEnd_00._M_current = (unsigned_long *)pvVar2->startPos;
  pvVar2 = std::
           vector<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
           ::back((vector<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
                   *)in_stack_fffffffffffffea0);
  this_01 = (Builder *)pvVar2->indexStartPos;
  uVar8 = this->_start[(long)indexEnd_00._M_current];
  local_129 = uVar8 == '\x06' || uVar8 == '\x13';
  local_40 = (unsigned_long *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
  local_38 = __gnu_cxx::
             __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator+(in_stack_fffffffffffffea8._M_current,
                         (difference_type)in_stack_fffffffffffffea0);
  local_60 = (unsigned_long *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
  local_58 = local_38._M_current;
  local_48 = local_60;
  local_50 = std::
             distance<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                       (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  if (local_50 == 0) {
    closeEmptyArrayOrObject
              ((Builder *)in_stack_fffffffffffffeb0._M_current,
               (ValueLength)in_stack_fffffffffffffea8._M_current,
               SUB81((ulong)in_stack_fffffffffffffea0 >> 0x38,0));
    local_10 = (int)this;
  }
  else {
    if ((((uVar8 == '\x13') || (uVar8 == '\x14')) ||
        ((uVar8 == '\x06' && ((this->options->buildUnindexedArrays & 1U) != 0)))) ||
       ((uVar8 == '\v' && (((this->options->buildUnindexedObjects & 1U) != 0 || (local_50 == 1))))))
    {
      local_68 = local_38._M_current;
      local_70 = local_48;
      indexStart_00._M_current._4_4_ = in_stack_ffffffffffffff04;
      indexStart_00._M_current._0_4_ = in_stack_ffffffffffffff00;
      bVar1 = closeCompactArrayOrObject
                        ((Builder *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                         (ValueLength)in_stack_fffffffffffffee8._M_current,
                         SUB81((ulong)this >> 0x38,0),indexStart_00,in_stack_fffffffffffffef8);
      if (bVar1) {
        if ((((uVar8 == '\v') || (uVar8 == '\x14')) &&
            ((this->options->checkAttributeUniqueness & 1U) != 0)) && (1 < local_50)) {
          Slice::Slice(&local_78,this->_start + (long)indexEnd_00._M_current);
          bVar1 = checkAttributeUniqueness
                            ((Builder *)in_stack_fffffffffffffeb0._M_current,
                             in_stack_fffffffffffffeb8);
          if (!bVar1) {
            uVar3 = __cxa_allocate_exception(0x18);
            Exception::Exception((Exception *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c);
            __cxa_throw(uVar3,&Exception::typeinfo,Exception::~Exception);
          }
        }
        return (int)this;
      }
    }
    if ((local_129 & 1U) == 0) {
      this->_start[(long)indexEnd_00._M_current] = '\v';
      local_94 = 8;
      obj._start = (uint8_t *)((this->_pos - (long)indexEnd_00._M_current) + local_50 + -6);
      VVar4 = effectivePaddingForOneByteMembers(this);
      if (obj._start + VVar4 < (uint8_t *)0x100) {
        local_94 = 1;
      }
      else {
        in_stack_fffffffffffffeb0._M_current =
             (unsigned_long *)((this->_pos - (long)indexEnd_00._M_current) + local_50 * 2);
        VVar4 = effectivePaddingForTwoByteMembers(this);
        if ((((Builder *)in_stack_fffffffffffffeb0._M_current)->_arena).buf_ + (VVar4 - 0x28) <
            (char *)0x10000) {
          local_94 = 2;
        }
        else if ((this->_pos - (long)indexEnd_00._M_current) + local_50 * 4 < 0x100000000) {
          local_94 = 4;
        }
      }
      if ((local_94 < 4) &&
         ((this->options->paddingBehavior == NoPadding ||
          ((local_94 == 1 && (this->options->paddingBehavior == Flexible)))))) {
        uVar6 = (ulong)(local_94 * 2 + 1);
        if ((long)indexEnd_00._M_current + 9U < this->_pos) {
          memmove(this->_start + (long)indexEnd_00._M_current + uVar6,
                  this->_start + (long)indexEnd_00._M_current + 9,
                  this->_pos - ((long)indexEnd_00._M_current + 9U));
        }
        rollback(in_stack_fffffffffffffea0,
                 CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
        for (local_b8 = 0; local_b8 < local_50; local_b8 = local_b8 + 1) {
          in_stack_fffffffffffffea8._M_current = (unsigned_long *)(9 - uVar6);
          puVar5 = __gnu_cxx::
                   __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                   ::operator[](&local_38,local_b8);
          *puVar5 = *puVar5 - (long)in_stack_fffffffffffffea8._M_current;
        }
      }
      reserve((Builder *)in_stack_fffffffffffffeb0._M_current,
              (ValueLength)in_stack_fffffffffffffea8._M_current);
      VVar4 = this->_pos;
      advance(in_stack_fffffffffffffea0,
              CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
      if (1 < local_50) {
        iVar9._M_current._4_4_ = in_stack_fffffffffffffef4;
        iVar9._M_current._0_4_ = in_stack_fffffffffffffef0;
        sortObjectIndex(this,in_stack_fffffffffffffed8,iVar9,in_stack_fffffffffffffee8);
      }
      for (local_d8 = 0; local_d8 < local_50; local_d8 = local_d8 + 1) {
        puVar5 = __gnu_cxx::
                 __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                 ::operator[](&local_38,local_d8);
        local_e0 = *puVar5;
        for (local_e8 = 0; local_e8 < local_94; local_e8 = local_e8 + 1) {
          this->_start[VVar4 + local_94 * local_d8 + local_e8] = (uint8_t)local_e0;
          local_e0 = local_e0 >> 8;
        }
      }
      if (1 < local_94) {
        if (local_94 == 2) {
          this->_start[(long)indexEnd_00._M_current] =
               this->_start[(long)indexEnd_00._M_current] + '\x01';
        }
        else if (local_94 == 4) {
          this->_start[(long)indexEnd_00._M_current] =
               this->_start[(long)indexEnd_00._M_current] + '\x02';
        }
        else {
          this->_start[(long)indexEnd_00._M_current] =
               this->_start[(long)indexEnd_00._M_current] + '\x03';
          reserve((Builder *)in_stack_fffffffffffffeb0._M_current,
                  (ValueLength)in_stack_fffffffffffffea8._M_current);
          appendLengthUnchecked<8ul>
                    ((Builder *)in_stack_fffffffffffffeb0._M_current,
                     (ValueLength)in_stack_fffffffffffffea8._M_current);
        }
      }
      local_f8 = this->_pos - (long)indexEnd_00._M_current;
      for (uVar7 = 1; uVar7 <= local_94; uVar7 = uVar7 + 1) {
        this->_start[(long)indexEnd_00._M_current + (ulong)uVar7] = (uint8_t)local_f8;
        local_f8 = local_f8 >> 8;
      }
      uVar6 = local_50;
      uVar7 = local_94;
      if (local_94 < 8) {
        while (in_stack_fffffffffffffef4 = uVar7 + 1, in_stack_fffffffffffffef4 <= local_94 * 2) {
          this->_start[(long)indexEnd_00._M_current + (ulong)in_stack_fffffffffffffef4] =
               (uint8_t)uVar6;
          uVar6 = uVar6 >> 8;
          uVar7 = in_stack_fffffffffffffef4;
        }
      }
      if (((this->options->checkAttributeUniqueness & 1U) != 0) && (1 < local_50)) {
        Slice::Slice((Slice *)&stack0xfffffffffffffee8,this->_start + (long)indexEnd_00._M_current);
        bVar1 = checkAttributeUniqueness((Builder *)in_stack_fffffffffffffeb0._M_current,obj);
        if (!bVar1) {
          this_00 = (Exception *)__cxa_allocate_exception(0x18);
          Exception::Exception(this_00,in_stack_fffffffffffffe9c);
          __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
        }
      }
      local_10 = (int)this;
      closeLevel((Builder *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    }
    else {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
      local_10 = (int)this;
      __gnu_cxx::
      __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator+((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                   *)in_stack_fffffffffffffea8._M_current,(difference_type)in_stack_fffffffffffffea0
                 );
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
      closeArray(this_01,CONCAT17(uVar8,CONCAT16(local_129,in_stack_ffffffffffffffd0)),iVar9,
                 indexEnd_00);
    }
  }
  return local_10;
}

Assistant:

Builder& Builder::close() {
  if (VELOCYPACK_UNLIKELY(isClosed())) {
    throw Exception(Exception::BuilderNeedOpenCompound);
  }
  VELOCYPACK_ASSERT(!_stack.empty());
  ValueLength const pos = _stack.back().startPos;
  ValueLength const indexStartPos = _stack.back().indexStartPos;
  uint8_t const head = _start[pos];

  VELOCYPACK_ASSERT(head == 0x06 || head == 0x0b || head == 0x13 ||
                    head == 0x14);

  bool const isArray = (head == 0x06 || head == 0x13);
  std::vector<ValueLength>::iterator indexStart =
      _indexes.begin() + indexStartPos;
  std::vector<ValueLength>::iterator indexEnd = _indexes.end();
  ValueLength const n = std::distance(indexStart, indexEnd);

  if (n == 0) {
    closeEmptyArrayOrObject(pos, isArray);
    return *this;
  }

  // From now on index.size() > 0
  VELOCYPACK_ASSERT(n > 0);

  // check if we can use the compact Array / Object format
  if (head == 0x13 || head == 0x14 ||
      (head == 0x06 && options->buildUnindexedArrays) ||
      (head == 0x0b && (options->buildUnindexedObjects || n == 1))) {
    if (closeCompactArrayOrObject(pos, isArray, indexStart, indexEnd)) {
      // And, if desired, check attribute uniqueness:
      if ((head == 0x0b || head == 0x14) && options->checkAttributeUniqueness &&
          n > 1 && !checkAttributeUniqueness(Slice(_start + pos))) {
        // duplicate attribute name!
        throw Exception(Exception::DuplicateAttributeName);
      }
      return *this;
    }
    // This might fall through, if closeCompactArrayOrObject gave up!
  }

  if (isArray) {
    closeArray(pos, _indexes.begin() + indexStartPos, _indexes.end());
    return *this;
  }

  // from here on we are sure that we are dealing with Object types only.

  // fix head byte in case a compact Array / Object was originally requested
  _start[pos] = 0x0b;

  // First determine byte length and its format:
  unsigned int offsetSize = 8;
  // can be 1, 2, 4 or 8 for the byte width of the offsets,
  // the byte length and the number of subvalues:
  if (_pos - pos + n - 6 + effectivePaddingForOneByteMembers() <= 0xff) {
    // We have so far used _pos - pos bytes, including the reserved 8
    // bytes for byte length and number of subvalues. In the 1-byte number
    // case we would win back 6 bytes but would need one byte per subvalue
    // for the index table
    offsetSize = 1;
    // One could move down things in the offsetSize == 2 case as well,
    // since we only need 4 bytes in the beginning. However, saving these
    // 4 bytes has been sacrificed on the Altar of Performance.
  } else if (_pos - pos + 2 * n + effectivePaddingForTwoByteMembers() <=
             0xffff) {
    offsetSize = 2;
  } else if (_pos - pos + 4 * n <= 0xffffffffu) {
    offsetSize = 4;
  }

  if (offsetSize < 4 &&
      (options->paddingBehavior == Options::PaddingBehavior::NoPadding ||
       (offsetSize == 1 &&
        options->paddingBehavior == Options::PaddingBehavior::Flexible))) {
    // Maybe we need to move down data:
    ValueLength targetPos = 1 + 2 * offsetSize;
    if (_pos > (pos + 9)) {
      ValueLength len = _pos - (pos + 9);
      memmove(_start + pos + targetPos, _start + pos + 9, checkOverflow(len));
    }
    ValueLength const diff = 9 - targetPos;
    rollback(diff);
    for (std::size_t i = 0; i < n; i++) {
      indexStart[i] -= diff;
    }
  }

  // Now build the table:
  reserve(offsetSize * n + (offsetSize == 8 ? 8 : 0));
  ValueLength tableBase = _pos;
  advance(offsetSize * n);
  // Object
  if (n >= 2) {
    sortObjectIndex(_start + pos, indexStart, indexEnd);
  }
  for (std::size_t i = 0; i < n; ++i) {
    uint64_t x = indexStart[i];
    for (std::size_t j = 0; j < offsetSize; ++j) {
      _start[tableBase + offsetSize * i + j] = x & 0xff;
      x >>= 8;
    }
  }
  // Finally fix the byte width in the type byte:
  if (offsetSize > 1) {
    if (offsetSize == 2) {
      _start[pos] += 1;
    } else if (offsetSize == 4) {
      _start[pos] += 2;
    } else {  // offsetSize == 8
      _start[pos] += 3;
      // write number of items
      reserve(8);
      appendLengthUnchecked<8>(n);
    }
  }

  // Fix the byte length in the beginning:
  ValueLength const byteLength = _pos - pos;
  ValueLength x = byteLength;
  for (unsigned int i = 1; i <= offsetSize; i++) {
    _start[pos + i] = x & 0xff;
    x >>= 8;
  }

  if (offsetSize < 8) {
    ValueLength x = n;
    for (unsigned int i = offsetSize + 1; i <= 2 * offsetSize; i++) {
      _start[pos + i] = x & 0xff;
      x >>= 8;
    }
  }

#ifdef VELOCYPACK_DEBUG
  // make sure byte size and number of items are actually written correctly
  if (offsetSize == 1) {
    VELOCYPACK_ASSERT(_start[pos] == 0x0b);
    // read byteLength
    uint64_t v = readIntegerFixed<uint64_t, 1>(_start + pos + 1);
    VELOCYPACK_ASSERT(byteLength == v);
    // read byteLength n
    v = readIntegerFixed<uint64_t, 1>(_start + pos + 1 + offsetSize);
    VELOCYPACK_ASSERT(n == v);
  } else if (offsetSize == 2) {
    VELOCYPACK_ASSERT(_start[pos] == 0x0c);
    // read byteLength
    uint64_t v = readIntegerFixed<uint64_t, 2>(_start + pos + 1);
    VELOCYPACK_ASSERT(byteLength == v);
    // read byteLength n
    v = readIntegerFixed<uint64_t, 2>(_start + pos + 1 + offsetSize);
    VELOCYPACK_ASSERT(n == v);
  } else if (offsetSize == 4) {
    VELOCYPACK_ASSERT(_start[pos] == 0x0d);
    // read byteLength
    uint64_t v = readIntegerFixed<uint64_t, 4>(_start + pos + 1);
    VELOCYPACK_ASSERT(byteLength == v);
    // read byteLength n
    v = readIntegerFixed<uint64_t, 4>(_start + pos + 1 + offsetSize);
    VELOCYPACK_ASSERT(n == v);
  } else if (offsetSize == 8) {
    VELOCYPACK_ASSERT(_start[pos] == 0x0e);
    uint64_t v = readIntegerFixed<uint64_t, 4>(_start + pos + 1);
    VELOCYPACK_ASSERT(byteLength == v);
  }
#endif

  // And, if desired, check attribute uniqueness:
  if (options->checkAttributeUniqueness && n > 1 &&
      !checkAttributeUniqueness(Slice(_start + pos))) {
    // duplicate attribute name!
    throw Exception(Exception::DuplicateAttributeName);
  }

  // Now the array or object is complete, we pop a ValueLength
  // off the _stack:
  closeLevel();

  return *this;
}